

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O2

REF_STATUS
ref_gather_scalar_surf_tec
          (REF_GRID ref_grid,REF_INT ldim,REF_DBL *scalar,char **scalar_names,char *filename)

{
  REF_CELL pRVar1;
  REF_NODE pRVar2;
  uint uVar3;
  uint uVar4;
  FILE *__s;
  undefined8 uVar5;
  char *pcVar6;
  ulong uVar7;
  REF_GLOB *l2c;
  uint local_5c;
  REF_GLOB nnode;
  REF_LONG ncell;
  REF_NODE local_48;
  REF_INT max_faceid;
  REF_INT min_faceid;
  REF_DBL *local_38;
  
  local_48 = ref_grid->node;
  local_5c = ldim;
  local_38 = scalar;
  if (ref_grid->mpi->id == 0) {
    __s = fopen(filename,"w");
    if (__s == (FILE *)0x0) {
      printf("unable to open %s\n",filename);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0xdda,"ref_gather_scalar_surf_tec","unable to open file");
      return 2;
    }
    fwrite("title=\"tecplot refine gather\"\n",0x1e,1,__s);
    fwrite("variables = \"x\" \"y\" \"z\"",0x17,1,__s);
    uVar3 = 0;
    if (0 < (int)local_5c) {
      uVar3 = local_5c;
    }
    if (scalar_names == (char **)0x0) {
      for (uVar4 = 1; uVar4 - uVar3 != 1; uVar4 = uVar4 + 1) {
        fprintf(__s," \"V%d\"",(ulong)uVar4);
      }
    }
    else {
      for (uVar7 = 0; uVar3 != uVar7; uVar7 = uVar7 + 1) {
        fprintf(__s," \"%s\"",scalar_names[uVar7]);
      }
    }
    fputc(10,__s);
  }
  else {
    __s = (FILE *)0x0;
  }
  uVar3 = ref_node_synchronize_globals(local_48);
  if (uVar3 == 0) {
    uVar4 = ref_grid_faceid_range(ref_grid,&min_faceid,&max_faceid);
    uVar3 = min_faceid;
    if (uVar4 == 0) {
      do {
        if (max_faceid < (int)uVar3) {
          if (ref_grid->mpi->id != 0) {
            return 0;
          }
          fclose(__s);
          return 0;
        }
        pRVar1 = ref_grid->cell[3];
        uVar4 = ref_grid_compact_cell_id_nodes(ref_grid,pRVar1,uVar3,&nnode,&ncell,&l2c);
        if (uVar4 != 0) {
          uVar7 = (ulong)uVar4;
          pcVar6 = "l2c";
          uVar5 = 0xded;
          goto LAB_0012523e;
        }
        if (0 < ncell && 0 < nnode) {
          if (ref_grid->mpi->id == 0) {
            fprintf(__s,"zone t=\"tri%d\", nodes=%ld, elements=%ld, datapacking=%s, zonetype=%s\n",
                    (ulong)uVar3,nnode,ncell,"point","fetriangle");
          }
          pRVar2 = local_48;
          uVar4 = ref_gather_node_tec_part(local_48,nnode,l2c,local_5c,local_38,(FILE *)__s);
          if (uVar4 != 0) {
            uVar7 = (ulong)uVar4;
            pcVar6 = "nodes";
            uVar5 = 0xdf7;
            goto LAB_0012523e;
          }
          uVar4 = ref_gather_cell_id_tec(pRVar2,pRVar1,uVar3,ncell,l2c,0,(FILE *)__s);
          if (uVar4 != 0) {
            uVar7 = (ulong)uVar4;
            pcVar6 = "t";
            uVar5 = 0xdfa;
            goto LAB_0012523e;
          }
        }
        free(l2c);
        pRVar1 = ref_grid->cell[6];
        uVar4 = ref_grid_compact_cell_id_nodes(ref_grid,pRVar1,uVar3,&nnode,&ncell,&l2c);
        if (uVar4 != 0) {
          uVar7 = (ulong)uVar4;
          pcVar6 = "l2c";
          uVar5 = 0xe01;
          goto LAB_0012523e;
        }
        if (0 < ncell && 0 < nnode) {
          if (ref_grid->mpi->id == 0) {
            fprintf(__s,"zone t=\"quad%d\", nodes=%ld, elements=%ld, datapacking=%s, zonetype=%s\n",
                    (ulong)uVar3,nnode,ncell,"point","fequadrilateral");
          }
          pRVar2 = local_48;
          uVar4 = ref_gather_node_tec_part(local_48,nnode,l2c,local_5c,local_38,(FILE *)__s);
          if (uVar4 != 0) {
            uVar7 = (ulong)uVar4;
            pcVar6 = "nodes";
            uVar5 = 0xe0b;
            goto LAB_0012523e;
          }
          uVar4 = ref_gather_cell_id_tec(pRVar2,pRVar1,uVar3,ncell,l2c,0,(FILE *)__s);
          if (uVar4 != 0) {
            uVar7 = (ulong)uVar4;
            pcVar6 = "t";
            uVar5 = 0xe0e;
            goto LAB_0012523e;
          }
        }
        free(l2c);
        uVar3 = uVar3 + 1;
      } while( true );
    }
    uVar7 = (ulong)uVar4;
    pcVar6 = "range";
    uVar5 = 0xde7;
  }
  else {
    uVar7 = (ulong)uVar3;
    pcVar6 = "sync";
    uVar5 = 0xde5;
  }
LAB_0012523e:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar5,
         "ref_gather_scalar_surf_tec",uVar7,pcVar6);
  return (REF_STATUS)uVar7;
}

Assistant:

REF_FCN REF_STATUS ref_gather_scalar_surf_tec(REF_GRID ref_grid, REF_INT ldim,
                                              REF_DBL *scalar,
                                              const char **scalar_names,
                                              const char *filename) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  FILE *file;
  REF_INT i;
  REF_GLOB nnode, *l2c;
  REF_LONG ncell;
  REF_INT min_faceid, max_faceid, cell_id;
  file = NULL;
  if (ref_grid_once(ref_grid)) {
    file = fopen(filename, "w");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");
    fprintf(file, "title=\"tecplot refine gather\"\n");
    fprintf(file, "variables = \"x\" \"y\" \"z\"");
    if (NULL != scalar_names) {
      for (i = 0; i < ldim; i++) fprintf(file, " \"%s\"", scalar_names[i]);
    } else {
      for (i = 0; i < ldim; i++) fprintf(file, " \"V%d\"", i + 1);
    }
    fprintf(file, "\n");
  }

  RSS(ref_node_synchronize_globals(ref_node), "sync");

  RSS(ref_grid_faceid_range(ref_grid, &min_faceid, &max_faceid), "range");

  for (cell_id = min_faceid; cell_id <= max_faceid; cell_id++) {
    ref_cell = ref_grid_tri(ref_grid);
    RSS(ref_grid_compact_cell_id_nodes(ref_grid, ref_cell, cell_id, &nnode,
                                       &ncell, &l2c),
        "l2c");
    if (nnode > 0 && ncell > 0) {
      if (ref_grid_once(ref_grid)) {
        fprintf(file,
                "zone t=\"tri%d\", nodes=" REF_GLOB_FMT
                ", elements=%ld, datapacking=%s, "
                "zonetype=%s\n",
                cell_id, nnode, ncell, "point", "fetriangle");
      }
      RSS(ref_gather_node_tec_part(ref_node, nnode, l2c, ldim, scalar, file),
          "nodes");
      RSS(ref_gather_cell_id_tec(ref_node, ref_cell, cell_id, ncell, l2c,
                                 REF_FALSE, file),
          "t");
    }
    ref_free(l2c);

    ref_cell = ref_grid_qua(ref_grid);
    RSS(ref_grid_compact_cell_id_nodes(ref_grid, ref_cell, cell_id, &nnode,
                                       &ncell, &l2c),
        "l2c");
    if (nnode > 0 && ncell > 0) {
      if (ref_grid_once(ref_grid)) {
        fprintf(file,
                "zone t=\"quad%d\", nodes=" REF_GLOB_FMT
                ", elements=%ld, datapacking=%s, "
                "zonetype=%s\n",
                cell_id, nnode, ncell, "point", "fequadrilateral");
      }
      RSS(ref_gather_node_tec_part(ref_node, nnode, l2c, ldim, scalar, file),
          "nodes");
      RSS(ref_gather_cell_id_tec(ref_node, ref_cell, cell_id, ncell, l2c,
                                 REF_FALSE, file),
          "t");
    }
    ref_free(l2c);
  }

  if (ref_grid_once(ref_grid)) fclose(file);

  return REF_SUCCESS;
}